

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall
ClipperLib::ClipperOffset::OffsetPoint(ClipperOffset *this,int j,int *k,JoinType jointype)

{
  Path *this_00;
  double dVar1;
  int k_00;
  pointer pDVar2;
  pointer pIVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  IntPoint local_48;
  
  k_00 = *k;
  pDVar2 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar9 = pDVar2[j].X;
  dVar10 = pDVar2[j].Y;
  dVar4 = pDVar2[k_00].X;
  dVar5 = pDVar2[k_00].Y;
  dVar11 = dVar4 * dVar10 - dVar5 * dVar9;
  this->m_sinA = dVar11;
  dVar1 = this->m_delta;
  dVar10 = dVar5 * dVar10;
  if (1.0 <= ABS(dVar11 * dVar1)) {
    dVar6 = 1.0;
    if ((1.0 < dVar11) || (dVar6 = -1.0, dVar11 < -1.0)) {
      dVar11 = dVar6;
      this->m_sinA = dVar11;
    }
  }
  else if (0.0 < dVar4 * dVar9 + dVar10) {
    pIVar3 = (this->m_srcPoly).
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start;
    dVar9 = dVar4 * dVar1 + (double)pIVar3[j].X;
    dVar10 = dVar5 * dVar1 + (double)pIVar3[j].Y;
    uVar7 = -(ulong)(dVar9 < 0.0);
    uVar8 = -(ulong)(dVar10 < 0.0);
    local_48.X = (cInt)((double)(uVar7 & 0xbfe0000000000000 | ~uVar7 & 0x3fe0000000000000) + dVar9);
    local_48.Y = (cInt)((double)(uVar8 & 0xbfe0000000000000 | ~uVar8 & 0x3fe0000000000000) + dVar10)
    ;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    emplace_back<ClipperLib::IntPoint>(&this->m_destPoly,&local_48);
    return;
  }
  if (dVar11 * dVar1 < 0.0) {
    this_00 = &this->m_destPoly;
    pIVar3 = (this->m_srcPoly).
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start;
    dVar9 = dVar4 * dVar1 + (double)pIVar3[j].X;
    dVar10 = dVar5 * dVar1 + (double)pIVar3[j].Y;
    uVar7 = -(ulong)(dVar9 < 0.0);
    uVar8 = -(ulong)(dVar10 < 0.0);
    local_48.X = (cInt)((double)(~uVar7 & 0x3fe0000000000000 | uVar7 & 0xbfe0000000000000) + dVar9);
    local_48.Y = (cInt)((double)(~uVar8 & 0x3fe0000000000000 | uVar8 & 0xbfe0000000000000) + dVar10)
    ;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    emplace_back<ClipperLib::IntPoint>(this_00,&local_48);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
              (this_00,(this->m_srcPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_start + j);
    pIVar3 = (this->m_srcPoly).
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start;
    pDVar2 = (this->m_normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start + j;
    dVar9 = this->m_delta * pDVar2->X + (double)pIVar3[j].X;
    dVar10 = this->m_delta * pDVar2->Y + (double)pIVar3[j].Y;
    uVar7 = -(ulong)(dVar9 < 0.0);
    uVar8 = -(ulong)(dVar10 < 0.0);
    local_48.X = (cInt)((double)(~uVar7 & 0x3fe0000000000000 | uVar7 & 0xbfe0000000000000) + dVar9);
    local_48.Y = (cInt)((double)(~uVar8 & 0x3fe0000000000000 | uVar8 & 0xbfe0000000000000) + dVar10)
    ;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    emplace_back<ClipperLib::IntPoint>(this_00,&local_48);
    goto LAB_00119ada;
  }
  if (jointype != jtSquare) {
    if (jointype == jtRound) {
      DoRound(this,j,k_00);
      goto LAB_00119ada;
    }
    if (jointype != jtMiter) goto LAB_00119ada;
    dVar9 = dVar9 * dVar4 + dVar10 + 1.0;
    if (this->m_miterLim <= dVar9) {
      DoMiter(this,j,k_00,dVar9);
      goto LAB_00119ada;
    }
  }
  DoSquare(this,j,k_00);
LAB_00119ada:
  *k = j;
  return;
}

Assistant:

void ClipperOffset::OffsetPoint(int j, int& k, JoinType jointype)
{
  //cross product ...
  m_sinA = (m_normals[k].X * m_normals[j].Y - m_normals[j].X * m_normals[k].Y);
  if (std::fabs(m_sinA * m_delta) < 1.0) 
  {
    //dot product ...
    double cosA = (m_normals[k].X * m_normals[j].X + m_normals[j].Y * m_normals[k].Y ); 
    if (cosA > 0) // angle => 0 degrees
    {
      m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + m_normals[k].X * m_delta),
        Round(m_srcPoly[j].Y + m_normals[k].Y * m_delta)));
      return; 
    }
    //else angle => 180 degrees   
  }
  else if (m_sinA > 1.0) m_sinA = 1.0;
  else if (m_sinA < -1.0) m_sinA = -1.0;

  if (m_sinA * m_delta < 0)
  {
    m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + m_normals[k].X * m_delta),
      Round(m_srcPoly[j].Y + m_normals[k].Y * m_delta)));
    m_destPoly.push_back(m_srcPoly[j]);
    m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + m_normals[j].X * m_delta),
      Round(m_srcPoly[j].Y + m_normals[j].Y * m_delta)));
  }
  else
    switch (jointype)
    {
      case jtMiter:
        {
          double r = 1 + (m_normals[j].X * m_normals[k].X +
            m_normals[j].Y * m_normals[k].Y);
          if (r >= m_miterLim) DoMiter(j, k, r); else DoSquare(j, k);
          break;
        }
      case jtSquare: DoSquare(j, k); break;
      case jtRound: DoRound(j, k); break;
    }
  k = j;
}